

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * httplib::detail::if2ip(string *__return_storage_ptr__,int address_family,string *ifn)

{
  short *psVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  size_type *psVar5;
  long *plVar6;
  size_type sStack_d8;
  char buf [16];
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type *local_90;
  size_type __dnew;
  size_type local_80 [2];
  long *local_70;
  ifaddrs *ifap;
  string addr_candidate;
  
  addr_candidate.field_2._12_4_ = address_family;
  getifaddrs(&local_70);
  ifap = (ifaddrs *)&addr_candidate._M_string_length;
  addr_candidate._M_dataplus._M_p = (pointer)0x0;
  addr_candidate._M_string_length._0_1_ = 0;
  if (local_70 != (long *)0x0) {
    local_98 = &__return_storage_ptr__->field_2;
    plVar6 = local_70;
    do {
      if (((plVar6[3] != 0) && (iVar3 = std::__cxx11::string::compare((char *)ifn), iVar3 == 0)) &&
         ((addr_candidate.field_2._12_4_ == 0 ||
          ((uint)*(ushort *)plVar6[3] == addr_candidate.field_2._12_4_)))) {
        psVar1 = (short *)plVar6[3];
        if (*psVar1 == 10) {
          if ((*(uint *)(psVar1 + 4) & 0xc0ff) != 0x80fe) {
            buf[8] = '\0';
            buf[9] = '\0';
            buf[10] = '\0';
            buf[0xb] = '\0';
            buf[0xc] = '\0';
            buf[0xd] = '\0';
            buf[0xe] = '\0';
            buf[0xf] = '\0';
            sStack_d8 = 0;
            buf[0] = '\0';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            pcVar4 = inet_ntop(10,psVar1 + 4,(char *)&sStack_d8,0x2e);
            if (pcVar4 != (char *)0x0) {
              bVar2 = *(byte *)(psVar1 + 4) & 0xfe;
              if (bVar2 == 0xfc) {
                local_a0 = 0x2e;
                local_90 = local_80;
                local_90 = (size_type *)
                           std::__cxx11::string::_M_create((ulong *)&local_90,(ulong)&local_a0);
                local_80[0] = local_a0;
                *(undefined8 *)((long)local_90 + 0x1e) = 0;
                *(undefined8 *)((long)local_90 + 0x26) = 0;
                local_90[2] = buf._8_8_;
                local_90[3] = 0;
                *local_90 = sStack_d8;
                local_90[1] = buf._0_8_;
                __dnew = local_a0;
                *(undefined1 *)((long)local_90 + local_a0) = 0;
                std::__cxx11::string::operator=((string *)&ifap,(string *)&local_90);
                if (local_90 != local_80) {
                  operator_delete(local_90,local_80[0] + 1);
                }
              }
              else {
                freeifaddrs(local_70);
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
                local_90 = (size_type *)0x2e;
                psVar5 = (size_type *)
                         std::__cxx11::string::_M_create
                                   ((ulong *)__return_storage_ptr__,(ulong)&local_90);
                (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar5;
                (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_90;
                *(undefined8 *)((long)psVar5 + 0x1e) = 0;
                *(undefined8 *)((long)psVar5 + 0x26) = 0;
                psVar5[2] = buf._8_8_;
                psVar5[3] = 0;
                *psVar5 = sStack_d8;
                psVar5[1] = buf._0_8_;
                __return_storage_ptr__->_M_string_length = (size_type)local_90;
                *(undefined1 *)((long)psVar5 + (long)local_90) = 0;
              }
              if (bVar2 != 0xfc) goto LAB_001bb63e;
            }
          }
        }
        else if ((*psVar1 == 2) &&
                (pcVar4 = inet_ntop(2,psVar1 + 2,(char *)&sStack_d8,0x10), pcVar4 != (char *)0x0)) {
          freeifaddrs(local_70);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
          local_90 = (size_type *)0x10;
          psVar5 = (size_type *)
                   std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_90)
          ;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar5;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = (size_type)local_90;
          *psVar5 = sStack_d8;
          psVar5[1] = buf._0_8_;
          __return_storage_ptr__->_M_string_length = (size_type)local_90;
          (__return_storage_ptr__->_M_dataplus)._M_p[(long)local_90] = '\0';
          goto LAB_001bb63e;
        }
      }
      plVar6 = (long *)*plVar6;
    } while (plVar6 != (long *)0x0);
  }
  freeifaddrs(local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (ifap == (ifaddrs *)&addr_candidate._M_string_length) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(addr_candidate._M_string_length._1_7_,(undefined1)addr_candidate._M_string_length)
    ;
    *(size_type *)((long)&__return_storage_ptr__->field_2 + 8) =
         addr_candidate.field_2._M_allocated_capacity;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)ifap;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(addr_candidate._M_string_length._1_7_,(undefined1)addr_candidate._M_string_length)
    ;
  }
  __return_storage_ptr__->_M_string_length = (size_type)addr_candidate._M_dataplus._M_p;
  addr_candidate._M_dataplus._M_p = (pointer)0x0;
  addr_candidate._M_string_length._0_1_ = 0;
  ifap = (ifaddrs *)&addr_candidate._M_string_length;
LAB_001bb63e:
  if (ifap != (ifaddrs *)&addr_candidate._M_string_length) {
    operator_delete(ifap,CONCAT71(addr_candidate._M_string_length._1_7_,
                                  (undefined1)addr_candidate._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string if2ip(int address_family, const std::string& ifn) {
            struct ifaddrs* ifap;
            getifaddrs(&ifap);
            std::string addr_candidate;
            for (auto ifa = ifap; ifa; ifa = ifa->ifa_next) {
                if (ifa->ifa_addr && ifn == ifa->ifa_name &&
                    (AF_UNSPEC == address_family ||
                        ifa->ifa_addr->sa_family == address_family)) {
                    if (ifa->ifa_addr->sa_family == AF_INET) {
                        auto sa = reinterpret_cast<struct sockaddr_in*>(ifa->ifa_addr);
                        char buf[INET_ADDRSTRLEN];
                        if (inet_ntop(AF_INET, &sa->sin_addr, buf, INET_ADDRSTRLEN)) {
                            freeifaddrs(ifap);
                            return std::string(buf, INET_ADDRSTRLEN);
                        }
                    } else if (ifa->ifa_addr->sa_family == AF_INET6) {
                        auto sa = reinterpret_cast<struct sockaddr_in6*>(ifa->ifa_addr);
                        if (!IN6_IS_ADDR_LINKLOCAL(&sa->sin6_addr)) {
                            char buf[INET6_ADDRSTRLEN] = {};
                            if (inet_ntop(AF_INET6, &sa->sin6_addr, buf, INET6_ADDRSTRLEN)) {
                                // equivalent to mac's IN6_IS_ADDR_UNIQUE_LOCAL
                                auto s6_addr_head = sa->sin6_addr.s6_addr[0];
                                if (s6_addr_head == 0xfc || s6_addr_head == 0xfd) {
                                    addr_candidate = std::string(buf, INET6_ADDRSTRLEN);
                                } else {
                                    freeifaddrs(ifap);
                                    return std::string(buf, INET6_ADDRSTRLEN);
                                }
                            }
                        }
                    }
                }
            }
            freeifaddrs(ifap);
            return addr_candidate;
        }